

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O2

void __thiscall SQCompiler::OptionalSemicolon(SQCompiler *this)

{
  bool bVar1;
  
  if (this->_token == 0x3b) {
    Lex(this);
    return;
  }
  bVar1 = IsEndOfStatement(this);
  if (bVar1) {
    return;
  }
  Error(this,"end of statement expected (; or lf)");
  return;
}

Assistant:

void OptionalSemicolon()
    {
        if(_token == _SC(';')) { Lex(); return; }
        if(!IsEndOfStatement()) {
            Error(_SC("end of statement expected (; or lf)"));
        }
    }